

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_cache.cpp
# Opt level: O2

void __thiscall libtorrent::cached_piece_entry::~cached_piece_entry(cached_piece_entry *this)

{
  node_ptr plVar1;
  node_ptr plVar2;
  
  std::
  unique_ptr<libtorrent::cached_block_entry[],_std::default_delete<libtorrent::cached_block_entry[]>_>
  ::~unique_ptr(&(this->blocks).
                 super_unique_ptr<libtorrent::cached_block_entry[],_std::default_delete<libtorrent::cached_block_entry[]>_>
               );
  std::unique_ptr<libtorrent::partial_hash,_std::default_delete<libtorrent::partial_hash>_>::
  ~unique_ptr(&this->hash);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->storage).
              super___shared_ptr<libtorrent::storage_interface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  plVar1 = (this->
           super_list_base_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>).
           super_type.super_type.super_list_node<void_*>.next_;
  if (plVar1 != (node_ptr)0x0) {
    plVar2 = (this->
             super_list_base_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>
             ).super_type.super_type.super_list_node<void_*>.prev_;
    plVar2->next_ = plVar1;
    plVar1->prev_ = plVar2;
    (this->super_list_base_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>).
    super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0;
    (this->super_list_base_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>).
    super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0;
  }
  return;
}

Assistant:

cached_piece_entry::~cached_piece_entry()
{
	TORRENT_ASSERT(piece_refcount == 0);
	TORRENT_ASSERT(jobs.empty());
	TORRENT_ASSERT(read_jobs.empty());
#if TORRENT_USE_ASSERTS
	if (blocks)
	{
		for (int i = 0; i < blocks_in_piece; ++i)
		{
			TORRENT_ASSERT(!blocks[i].pending);
			TORRENT_ASSERT(blocks[i].refcount == 0);
			TORRENT_ASSERT(blocks[i].hashing_count == 0);
			TORRENT_ASSERT(blocks[i].flushing_count == 0);
		}
	}
	in_use = false;
#endif
}